

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O0

void __thiscall
draco::MeshAttributeCornerTable::AddSeamEdge(MeshAttributeCornerTable *this,CornerIndex c)

{
  bool bVar1;
  CornerTable *this_00;
  size_type __n;
  uint in_ESI;
  long in_RDI;
  CornerIndex opp_corner;
  CornerTable *in_stack_fffffffffffffef8;
  CornerIndex in_stack_ffffffffffffff00;
  CornerTable *in_stack_ffffffffffffff08;
  CornerIndex in_stack_ffffffffffffff10;
  CornerIndex corner;
  size_type in_stack_ffffffffffffff18;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff20;
  vector<bool,_std::allocator<bool>_> *this_01;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_ac;
  reference local_a8;
  uint local_94;
  uint local_90;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_8c;
  reference local_88;
  reference local_78;
  uint local_64;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_60;
  uint local_5c;
  uint local_58;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_54;
  reference local_50;
  uint local_3c;
  uint local_38;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_34;
  reference local_30;
  reference local_20;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_4;
  
  local_4.value_ = in_ESI;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_4);
  local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::_Bit_reference::operator=(&local_20,true);
  this_01 = *(vector<bool,_std::allocator<bool>_> **)(in_RDI + 0xa0);
  local_3c = local_4.value_;
  local_38 = (uint)CornerTable::Next(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  local_34.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_34);
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,in_stack_ffffffffffffff18)
  ;
  std::_Bit_reference::operator=(&local_30,true);
  local_5c = local_4.value_;
  local_58 = (uint)CornerTable::Previous(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  local_54.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_54);
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,in_stack_ffffffffffffff18)
  ;
  std::_Bit_reference::operator=(&local_50,true);
  local_64 = local_4.value_;
  local_60.value_ = (uint)CornerTable::Opposite(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00)
  ;
  bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                    (&local_60,
                     (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x50) = 0;
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_60);
    local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (this_01,in_stack_ffffffffffffff18);
    std::_Bit_reference::operator=(&local_78,true);
    this_00 = (CornerTable *)(in_RDI + 0x28);
    local_94 = local_60.value_;
    local_90 = (uint)CornerTable::Next(this_00,in_stack_ffffffffffffff10);
    local_8c.value_ = (uint)CornerTable::Vertex(this_00,in_stack_ffffffffffffff10);
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_8c);
    local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (this_01,in_stack_ffffffffffffff18);
    std::_Bit_reference::operator=(&local_88,true);
    __n = in_RDI + 0x28;
    corner.value_ = (uint)*(undefined8 *)(in_RDI + 0xa0);
    CornerTable::Previous(this_00,corner);
    local_ac.value_ = (uint)CornerTable::Vertex(this_00,corner);
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_ac);
    local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n);
    std::_Bit_reference::operator=(&local_a8,true);
  }
  return;
}

Assistant:

void MeshAttributeCornerTable::AddSeamEdge(CornerIndex c) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  is_edge_on_seam_[c.value()] = true;
  // Mark seam vertices.
  is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Next(c)).value()] =
      true;
  is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Previous(c))
                         .value()] = true;

  const CornerIndex opp_corner = corner_table_->Opposite(c);
  if (opp_corner != kInvalidCornerIndex) {
    no_interior_seams_ = false;
    is_edge_on_seam_[opp_corner.value()] = true;
    is_vertex_on_seam_[corner_table_->Vertex(corner_table_->Next(opp_corner))
                           .value()] = true;
    is_vertex_on_seam_
        [corner_table_->Vertex(corner_table_->Previous(opp_corner)).value()] =
            true;
  }
}